

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_gzio(char *fname,Byte *uncompr,uLong uncomprLen)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  int iVar4;
  int extraout_EAX_06;
  size_t sVar5;
  char **ppcVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  Byte *compr;
  Byte *uncompr_00;
  ulong uVar11;
  ulong uVar12;
  ulong *__s1;
  ulong *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  char *__s1_00;
  undefined8 unaff_RBP;
  undefined4 uVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  int *piVar19;
  ulong *puVar20;
  ulong *puVar21;
  uint uVar22;
  char **unaff_R13;
  ulong **ppuVar23;
  int err;
  uLong auStack_500 [2];
  undefined1 *puStack_4f0;
  char *pcStack_4e8;
  code *pcStack_4e0;
  ulong uStack_4d8;
  undefined4 uStack_4d0;
  undefined4 uStack_4b8;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  uLong uStack_478;
  char *pcStack_468;
  undefined1 *puStack_460;
  code *pcStack_458;
  char *pcStack_450;
  int iStack_448;
  undefined1 *puStack_438;
  undefined4 uStack_430;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_400;
  uLong uStack_3f0;
  ulong uStack_3d8;
  code *pcStack_3d0;
  ulong uStack_3c8;
  uint uStack_3c0;
  undefined4 uStack_3a8;
  undefined8 uStack_388;
  undefined8 uStack_380;
  undefined8 uStack_378;
  char *pcStack_358;
  ulong uStack_350;
  code *pcStack_348;
  char *pcStack_338;
  uint uStack_330;
  ulong uStack_320;
  undefined4 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  long lStack_2c8;
  ulong *puStack_2c0;
  ulong uStack_2b8;
  code *pcStack_2b0;
  ulong uStack_2a0;
  undefined4 uStack_298;
  undefined4 uStack_280;
  ulong uStack_278;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  ulong uStack_230;
  ulong *puStack_228;
  code *pcStack_218;
  ulong *puStack_210;
  uint uStack_208;
  ulong *puStack_1f8;
  uint uStack_1f0;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  char *pcStack_198;
  char **ppcStack_190;
  ulong uStack_188;
  code *pcStack_180;
  ulong uStack_178;
  undefined4 uStack_170;
  ulong uStack_168;
  undefined4 uStack_158;
  ulong uStack_150;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  char *pcStack_108;
  char *pcStack_100;
  size_t sStack_f8;
  int *piStack_f0;
  code *pcStack_e8;
  char *pcStack_d8;
  undefined4 uStack_d0;
  size_t sStack_c8;
  int *piStack_c0;
  undefined4 uStack_b8;
  char *pcStack_b0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  Byte *pBStack_68;
  size_t sStack_60;
  char **ppcStack_58;
  uLong uStack_50;
  int *piStack_48;
  char local_2c [4];
  
  sVar5 = strlen(hello);
  ppcVar6 = (char **)gzopen64(fname,"wb");
  piVar7 = (int *)fname;
  if (ppcVar6 == (char **)0x0) {
LAB_00102e65:
    ppcVar6 = unaff_R13;
    test_gzio_cold_11();
LAB_00102e6a:
    test_gzio_cold_1();
LAB_00102e77:
    test_gzio_cold_2();
    fname = (char *)piVar7;
LAB_00102e84:
    piVar7 = (int *)fname;
    test_gzio_cold_10();
LAB_00102e89:
    test_gzio_cold_3();
LAB_00102e96:
    test_gzio_cold_4();
LAB_00102e9e:
    test_gzio_cold_6();
LAB_00102ea3:
    test_gzio_cold_7();
LAB_00102ea8:
    pcVar14 = local_2c;
    piVar19 = piVar7;
    test_gzio_cold_8();
  }
  else {
    gzputc(ppcVar6,0x68);
    iVar2 = gzputs(ppcVar6,"ello");
    if (iVar2 != 4) goto LAB_00102e6a;
    iVar2 = gzprintf(ppcVar6,", %s!","hello");
    if (iVar2 != 8) goto LAB_00102e77;
    gzseek64(ppcVar6,1,1);
    gzclose(ppcVar6);
    piVar7 = (int *)gzopen64(fname,"rb");
    if (piVar7 == (int *)0x0) goto LAB_00102e84;
    uVar22 = (int)sVar5 + 1;
    sVar5 = (size_t)uVar22;
    builtin_memcpy(uncompr,"garbage",8);
    uVar3 = gzread(piVar7,uncompr,uncomprLen & 0xffffffff);
    if (uVar3 != uVar22) goto LAB_00102e89;
    iVar2 = strcmp((char *)uncompr,hello);
    if (iVar2 != 0) goto LAB_00102e96;
    printf("gzread(): %s\n",uncompr);
    sVar5 = gzseek64(piVar7,0xfffffffffffffff8,1);
    if ((sVar5 != 6) || (lVar8 = gztell64(piVar7), lVar8 != 6)) {
      test_gzio_cold_5();
      unaff_R13 = ppcVar6;
      goto LAB_00102e65;
    }
    if (*piVar7 == 0) {
      uVar3 = gzgetc(piVar7);
    }
    else {
      *piVar7 = *piVar7 + -1;
      *(long *)(piVar7 + 4) = *(long *)(piVar7 + 4) + 1;
      pbVar1 = *(byte **)(piVar7 + 2);
      *(byte **)(piVar7 + 2) = pbVar1 + 1;
      uVar3 = (uint)*pbVar1;
    }
    if (uVar3 != 0x20) goto LAB_00102e9e;
    iVar2 = gzungetc(0x20,piVar7);
    if (iVar2 != 0x20) goto LAB_00102ea3;
    gzgets(piVar7,uncompr,uncomprLen & 0xffffffff);
    sVar9 = strlen((char *)uncompr);
    if (sVar9 != 7) goto LAB_00102ea8;
    pcVar14 = hello + 6;
    piVar19 = (int *)uncompr;
    iVar2 = strcmp((char *)uncompr,hello + 6);
    if (iVar2 == 0) {
      printf("gzgets() after gzseek: %s\n",uncompr);
      gzclose(piVar7);
      return;
    }
  }
  test_gzio_cold_9();
  pcStack_e8 = (code *)0x102edd;
  pBStack_68 = uncompr;
  sStack_60 = sVar5;
  ppcStack_58 = ppcVar6;
  uStack_50 = uncomprLen;
  piStack_48 = piVar7;
  sVar5 = strlen(hello);
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uVar15 = 0xffffffff;
  uVar11 = 0x70;
  pcStack_e8 = (code *)0x102f0a;
  iVar2 = deflateInit_(&pcStack_d8,0xffffffff,"1.2.11");
  if (iVar2 == 0) {
    sVar5 = sVar5 + 1;
    ppcVar6 = &pcStack_d8;
    pcStack_d8 = hello;
    unaff_RBP = 1;
    piStack_c0 = piVar19;
    do {
      if ((sStack_c8 == sVar5) || (pcVar14 <= pcStack_b0)) goto LAB_00102f52;
      uStack_b8 = 1;
      uStack_d0 = 1;
      pcStack_e8 = (code *)0x102f47;
      iVar2 = deflate(ppcVar6,0);
    } while (iVar2 == 0);
    pcStack_e8 = (code *)0x102f52;
    test_deflate_cold_4();
LAB_00102f52:
    do {
      uStack_b8 = 1;
      uVar15 = 4;
      pcStack_e8 = (code *)0x102f68;
      iVar2 = deflate();
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_e8 = (code *)0x102f95;
      test_deflate_cold_3();
      goto LAB_00102f95;
    }
    pcStack_e8 = (code *)0x102f7b;
    uVar3 = deflateEnd(&pcStack_d8);
    if (uVar3 == 0) {
      return;
    }
  }
  else {
LAB_00102f95:
    pcStack_e8 = (code *)0x102f9c;
    test_deflate_cold_1();
    uVar3 = extraout_EAX;
  }
  uVar17 = (ulong)uVar3;
  pcStack_e8 = test_inflate;
  test_deflate_cold_2();
  pcStack_100 = hello;
  *__s1 = 0x65676162726167;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_170 = 0;
  pcVar16 = "1.2.11";
  pcStack_180 = (code *)0x102ff9;
  uVar12 = uVar11;
  uStack_178 = uVar17;
  pcStack_108 = pcVar14;
  sStack_f8 = sVar5;
  piStack_f0 = piVar19;
  pcStack_e8 = (code *)unaff_RBP;
  iVar2 = inflateInit_(&uStack_178,"1.2.11",0x70);
  puVar21 = (ulong *)hello;
  if (iVar2 == 0) {
    unaff_RBP = 1;
    do {
      if ((uVar11 <= uStack_150) || (uVar15 <= uStack_168)) goto LAB_0010302e;
      uStack_158 = 1;
      uStack_170 = 1;
      pcVar16 = (char *)0x0;
      pcStack_180 = (code *)0x103025;
      iVar2 = inflate(&uStack_178);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_180 = (code *)0x103072;
      test_inflate_cold_4();
      puVar21 = &uStack_178;
      goto LAB_00103072;
    }
LAB_0010302e:
    pcStack_180 = (code *)0x103036;
    uVar3 = inflateEnd(&uStack_178);
    puVar21 = &uStack_178;
    if (uVar3 != 0) goto LAB_00103079;
    pcVar16 = hello;
    pcStack_180 = (code *)0x103049;
    puVar20 = __s1;
    iVar2 = strcmp((char *)__s1,hello);
    puVar21 = &uStack_178;
    if (iVar2 == 0) {
      pcStack_180 = (code *)0x10305e;
      printf("inflate(): %s\n",__s1);
      return;
    }
  }
  else {
LAB_00103072:
    pcStack_180 = (code *)0x103079;
    test_inflate_cold_1();
    uVar3 = extraout_EAX_00;
LAB_00103079:
    puVar20 = (ulong *)(ulong)uVar3;
    pcStack_180 = (code *)0x103080;
    test_inflate_cold_2();
  }
  pcStack_180 = test_large_deflate;
  test_inflate_cold_3();
  ppuVar23 = &puStack_210;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uVar17 = 1;
  lVar8 = 0x70;
  pcStack_218 = (code *)0x1030c6;
  pcStack_198 = (char *)puVar21;
  ppcStack_190 = ppcVar6;
  uStack_188 = uVar11;
  pcStack_180 = (code *)uVar15;
  iVar2 = deflateInit_(&puStack_210,1,"1.2.11");
  if (iVar2 == 0) {
    uVar17 = 0;
    pcStack_218 = (code *)0x1030e6;
    puStack_210 = extraout_RDX;
    uStack_208 = (uint)uVar12;
    puStack_1f8 = puVar20;
    uStack_1f0 = (uint)pcVar16;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_0010317e;
    if (uStack_208 != 0) goto LAB_00103185;
    pcStack_218 = (code *)0x103108;
    deflateParams(&puStack_210,0,0);
    uStack_208 = (uint)pcVar16 >> 1;
    pcVar16 = (char *)(ulong)uStack_208;
    uVar17 = 0;
    pcStack_218 = (code *)0x10311d;
    puStack_210 = puVar20;
    iVar2 = deflate(&puStack_210);
    if (iVar2 != 0) goto LAB_0010318a;
    pcStack_218 = (code *)0x103136;
    deflateParams(&puStack_210,9,1);
    uVar17 = 0;
    pcStack_218 = (code *)0x103147;
    puStack_210 = extraout_RDX;
    uStack_208 = (uint)uVar12;
    iVar2 = deflate(&puStack_210);
    if (iVar2 != 0) goto LAB_00103191;
    uVar17 = 4;
    pcStack_218 = (code *)0x103158;
    iVar2 = deflate(&puStack_210);
    ppuVar23 = &puStack_210;
    if (iVar2 != 1) goto LAB_00103198;
    pcStack_218 = (code *)0x103165;
    uVar3 = deflateEnd(&puStack_210);
    ppuVar23 = &puStack_210;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_218 = (code *)0x10317e;
    test_large_deflate_cold_1();
LAB_0010317e:
    pcStack_218 = (code *)0x103185;
    test_large_deflate_cold_2();
LAB_00103185:
    pcStack_218 = (code *)0x10318a;
    test_large_deflate_cold_3();
LAB_0010318a:
    ppuVar23 = (ulong **)pcVar16;
    pcStack_218 = (code *)0x103191;
    test_large_deflate_cold_4();
LAB_00103191:
    pcStack_218 = (code *)0x103198;
    test_large_deflate_cold_5();
LAB_00103198:
    pcStack_218 = (code *)0x10319d;
    test_large_deflate_cold_6();
    uVar3 = extraout_EAX_01;
  }
  uVar11 = (ulong)uVar3;
  pcStack_218 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX_00 = 0x65676162726167;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  uStack_298 = (undefined4)uVar17;
  pcVar14 = "1.2.11";
  pcStack_2b0 = (code *)0x1031f4;
  uStack_2a0 = uVar11;
  uStack_230 = uVar12;
  puStack_228 = puVar20;
  pcStack_218 = (code *)ppuVar23;
  iVar2 = inflateInit_(&uStack_2a0,"1.2.11",0x70);
  if (iVar2 == 0) {
    puVar20 = &uStack_2a0;
    do {
      uStack_280 = (undefined4)lVar8;
      pcVar14 = (char *)0x0;
      pcStack_2b0 = (code *)0x103210;
      iVar2 = inflate(puVar20);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_2b0 = (code *)0x103257;
      test_large_inflate_cold_4();
      goto LAB_00103257;
    }
    pcStack_2b0 = (code *)0x103223;
    uVar3 = inflateEnd(&uStack_2a0);
    if (uVar3 != 0) goto LAB_0010325e;
    uVar17 = uVar17 >> 1;
    uVar11 = uStack_278;
    if (uStack_278 == uVar17 + lVar8 * 2) {
      pcStack_2b0 = (code *)0x103244;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103257:
    pcStack_2b0 = (code *)0x10325e;
    test_large_inflate_cold_1();
    uVar3 = extraout_EAX_02;
LAB_0010325e:
    uVar11 = (ulong)uVar3;
    pcStack_2b0 = (code *)0x103265;
    test_large_inflate_cold_2();
  }
  pcStack_2b0 = test_flush;
  test_large_inflate_cold_3();
  pcStack_348 = (code *)0x10328a;
  lStack_2c8 = lVar8;
  puStack_2c0 = puVar20;
  uStack_2b8 = uVar17;
  sVar5 = strlen(hello);
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uVar15 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_348 = (code *)0x1032b7;
  iVar2 = deflateInit_(&pcStack_338,0xffffffff,"1.2.11");
  if (iVar2 == 0) {
    pcStack_338 = hello;
    uStack_330 = 3;
    uStack_318 = *(undefined4 *)pcVar14;
    uVar15 = 3;
    pcStack_348 = (code *)0x1032dd;
    uStack_320 = uVar11;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_0010332a;
    *(char *)(uVar11 + 3) = *(char *)(uVar11 + 3) + '\x01';
    uStack_330 = (int)sVar5 - 2;
    sVar5 = (size_t)uStack_330;
    uVar15 = 4;
    pcStack_348 = (code *)0x1032fc;
    uVar3 = deflate();
    if (1 < uVar3) goto LAB_00103331;
    pcStack_348 = (code *)0x10330b;
    uVar3 = deflateEnd(&pcStack_338);
    if (uVar3 == 0) {
      *(undefined8 *)pcVar14 = uStack_310;
      return;
    }
  }
  else {
    pcStack_348 = (code *)0x10332a;
    test_flush_cold_1();
LAB_0010332a:
    pcStack_348 = (code *)0x103331;
    test_flush_cold_2();
LAB_00103331:
    pcStack_348 = (code *)0x103338;
    test_flush_cold_4();
    uVar3 = extraout_EAX_03;
  }
  uVar12 = (ulong)uVar3;
  pcStack_348 = test_sync;
  test_flush_cold_3();
  *extraout_RDX_01 = 0x65676162726167;
  uStack_388 = 0;
  uStack_380 = 0;
  uStack_378 = 0;
  uStack_3c0 = 2;
  pcVar16 = "1.2.11";
  pcStack_3d0 = (code *)0x10338e;
  uStack_3c8 = uVar12;
  pcStack_358 = pcVar14;
  uStack_350 = uVar11;
  pcStack_348 = (code *)sVar5;
  iVar2 = inflateInit_(&uStack_3c8,"1.2.11",0x70);
  if (iVar2 == 0) {
    uStack_3a8 = SUB84(ppcVar6,0);
    pcVar16 = (char *)0x0;
    pcStack_3d0 = (code *)0x1033a4;
    iVar2 = inflate();
    if (iVar2 != 0) goto LAB_001033fc;
    uStack_3c0 = (int)uVar15 - 2;
    uVar15 = (ulong)uStack_3c0;
    pcStack_3d0 = (code *)0x1033b8;
    iVar2 = inflateSync();
    if (iVar2 != 0) goto LAB_00103403;
    pcVar16 = (char *)0x4;
    pcStack_3d0 = (code *)0x1033c9;
    iVar2 = inflate(&uStack_3c8);
    if (iVar2 != -3) goto LAB_0010340a;
    pcStack_3d0 = (code *)0x1033d6;
    uVar3 = inflateEnd(&uStack_3c8);
    if (uVar3 == 0) {
      pcStack_3d0 = (code *)0x1033eb;
      printf("after inflateSync(): hel%s\n",extraout_RDX_01);
      return;
    }
  }
  else {
    pcStack_3d0 = (code *)0x1033fc;
    test_sync_cold_1();
LAB_001033fc:
    pcStack_3d0 = (code *)0x103403;
    test_sync_cold_2();
LAB_00103403:
    pcStack_3d0 = (code *)0x10340a;
    test_sync_cold_3();
LAB_0010340a:
    pcStack_3d0 = (code *)0x10340f;
    test_sync_cold_4();
    uVar3 = extraout_EAX_04;
  }
  puVar21 = (ulong *)(ulong)uVar3;
  pcStack_3d0 = test_dict_deflate;
  test_sync_cold_5();
  uStack_410 = 0;
  uStack_408 = 0;
  uStack_400 = 0;
  uVar13 = 9;
  pcVar14 = (char *)0x70;
  pcStack_458 = (code *)0x10344d;
  uStack_3d8 = uVar15;
  pcStack_3d0 = (code *)ppcVar6;
  iVar2 = deflateInit_(&pcStack_450,9,"1.2.11");
  if (iVar2 == 0) {
    uVar13 = 0x104348;
    pcStack_458 = (code *)0x103465;
    iVar2 = deflateSetDictionary(&pcStack_450,"hello",6);
    if (iVar2 != 0) goto LAB_001034c3;
    dictId = uStack_3f0;
    uStack_430 = SUB84(pcVar16,0);
    pcStack_450 = hello;
    pcStack_458 = (code *)0x10348e;
    puStack_438 = (undefined1 *)puVar21;
    sVar5 = strlen(hello);
    iStack_448 = (int)sVar5 + 1;
    uVar13 = 4;
    pcStack_458 = (code *)0x1034a1;
    iVar2 = deflate(&pcStack_450);
    ppcVar6 = &pcStack_450;
    if (iVar2 != 1) goto LAB_001034ca;
    pcStack_458 = (code *)0x1034ae;
    uVar3 = deflateEnd(&pcStack_450);
    ppcVar6 = &pcStack_450;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_458 = (code *)0x1034c3;
    test_dict_deflate_cold_1();
LAB_001034c3:
    pcStack_458 = (code *)0x1034ca;
    test_dict_deflate_cold_2();
LAB_001034ca:
    pcStack_458 = (code *)0x1034cf;
    test_dict_deflate_cold_3();
    uVar3 = extraout_EAX_05;
  }
  uVar11 = (ulong)uVar3;
  pcStack_458 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1_00,"garbage",8);
  uStack_498 = 0;
  uStack_490 = 0;
  uStack_488 = 0;
  pcVar18 = "1.2.11";
  pcStack_4e0 = (code *)0x10351e;
  uStack_4d8 = uVar11;
  uStack_4d0 = uVar13;
  pcStack_468 = pcVar16;
  puStack_460 = (undefined1 *)puVar21;
  pcStack_458 = (code *)ppcVar6;
  iVar2 = inflateInit_(&uStack_4d8,"1.2.11",0x70);
  if (iVar2 == 0) {
    uStack_4b8 = SUB84(pcVar14,0);
    pcVar14 = "hello";
    do {
      pcVar18 = (char *)0x0;
      pcStack_4e0 = (code *)0x103542;
      iVar2 = inflate(&uStack_4d8);
      if (iVar2 == 2) {
        if (uStack_478 != dictId) {
          pcStack_4e0 = (code *)0x1035b6;
          test_dict_inflate_cold_2();
          puVar21 = &uStack_4d8;
          goto LAB_001035b6;
        }
        pcVar18 = "hello";
        pcStack_4e0 = (code *)0x10356c;
        iVar2 = inflateSetDictionary(&uStack_4d8,"hello",6);
      }
      else if (iVar2 == 1) goto LAB_00103577;
    } while (iVar2 == 0);
    pcStack_4e0 = (code *)0x103577;
    test_dict_inflate_cold_5();
LAB_00103577:
    pcStack_4e0 = (code *)0x10357f;
    iVar2 = inflateEnd(&uStack_4d8);
    puVar21 = &uStack_4d8;
    if (iVar2 == 0) {
      pcVar18 = hello;
      pcStack_4e0 = (code *)0x103592;
      pcVar16 = __s1_00;
      iVar4 = strcmp(__s1_00,hello);
      iVar2 = (int)pcVar16;
      puVar21 = &uStack_4d8;
      if (iVar4 == 0) {
        pcStack_4e0 = (code *)0x1035a7;
        printf("inflate with dictionary: %s\n",__s1_00);
        return;
      }
      goto LAB_001035c4;
    }
  }
  else {
LAB_001035b6:
    pcStack_4e0 = (code *)0x1035bd;
    test_dict_inflate_cold_1();
    iVar2 = extraout_EAX_06;
  }
  pcStack_4e0 = (code *)0x1035c4;
  test_dict_inflate_cold_3();
LAB_001035c4:
  pcStack_4e0 = main;
  test_dict_inflate_cold_4();
  auStack_500[0] = 40000;
  puStack_4f0 = (undefined1 *)puVar21;
  pcStack_4e8 = pcVar14;
  pcStack_4e0 = (code *)unaff_RBP;
  pcVar14 = (char *)zlibVersion();
  if (*pcVar14 == '1') {
    pcVar14 = (char *)zlibVersion();
    iVar4 = strcmp(pcVar14,"1.2.11");
    if (iVar4 != 0) {
      main_cold_2();
    }
    uVar10 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.11",0x12b0,uVar10);
    compr = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr,40000,uncompr_00,40000);
      if (iVar2 < 2) {
        pcVar14 = "foo.gz";
      }
      else {
        pcVar14 = *(char **)(pcVar18 + 8);
      }
      test_gzio(pcVar14,uncompr_00,40000);
      test_deflate(compr,40000);
      test_inflate(compr,40000,uncompr_00,40000);
      test_large_deflate(compr,40000,uncompr_00,40000);
      test_large_inflate(compr,40000,uncompr_00,40000);
      test_flush(compr,auStack_500);
      test_sync(compr,auStack_500[0],uncompr_00,40000);
      auStack_500[0] = 40000;
      test_dict_deflate(compr,40000);
      test_dict_inflate(compr,40000,uncompr_00,40000);
      free(compr);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_gzio(fname, uncompr, uncomprLen)
    const char *fname; /* compressed file name */
    Byte *uncompr;
    uLong uncomprLen;
{
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
#else
    int err;
    int len = (int)strlen(hello)+1;
    gzFile file;
    z_off_t pos;

    file = gzopen(fname, "wb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    gzputc(file, 'h');
    if (gzputs(file, "ello") != 4) {
        fprintf(stderr, "gzputs err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (gzprintf(file, ", %s!", "hello") != 8) {
        fprintf(stderr, "gzprintf err: %s\n", gzerror(file, &err));
        exit(1);
    }
    gzseek(file, 1L, SEEK_CUR); /* add one zero byte */
    gzclose(file);

    file = gzopen(fname, "rb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    strcpy((char*)uncompr, "garbage");

    if (gzread(file, uncompr, (unsigned)uncomprLen) != len) {
        fprintf(stderr, "gzread err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad gzread: %s\n", (char*)uncompr);
        exit(1);
    } else {
        printf("gzread(): %s\n", (char*)uncompr);
    }

    pos = gzseek(file, -8L, SEEK_CUR);
    if (pos != 6 || gztell(file) != pos) {
        fprintf(stderr, "gzseek error, pos=%ld, gztell=%ld\n",
                (long)pos, (long)gztell(file));
        exit(1);
    }

    if (gzgetc(file) != ' ') {
        fprintf(stderr, "gzgetc error\n");
        exit(1);
    }

    if (gzungetc(' ', file) != ' ') {
        fprintf(stderr, "gzungetc error\n");
        exit(1);
    }

    gzgets(file, (char*)uncompr, (int)uncomprLen);
    if (strlen((char*)uncompr) != 7) { /* " hello!" */
        fprintf(stderr, "gzgets err after gzseek: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello + 6)) {
        fprintf(stderr, "bad gzgets after gzseek\n");
        exit(1);
    } else {
        printf("gzgets() after gzseek: %s\n", (char*)uncompr);
    }

    gzclose(file);
#endif
}